

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::DepthRangeCompareCase::DepthRangeCompareCase
          (DepthRangeCompareCase *this,Context *context,char *name,char *desc,Vec4 *depthCoord,
          float zNear,float zFar,deUint32 compareFunc)

{
  int i;
  long lVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DepthRangeCompareCase_0212e678;
  lVar1 = 0;
  do {
    (this->m_depthCoord).m_data[lVar1] = depthCoord->m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  this->m_zNear = zNear;
  this->m_zFar = zFar;
  this->m_compareFunc = compareFunc;
  return;
}

Assistant:

DepthRangeCompareCase::DepthRangeCompareCase (Context& context, const char* name, const char* desc, const tcu::Vec4& depthCoord, const float zNear, const float zFar, const deUint32 compareFunc)
	: TestCase			(context, name, desc)
	, m_depthCoord		(depthCoord)
	, m_zNear			(zNear)
	, m_zFar			(zFar)
	, m_compareFunc		(compareFunc)
{
}